

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void __thiscall
Fossilize::StateRecorder::init_recording_synchronized(StateRecorder *this,DatabaseInterface *iface)

{
  Impl *pIVar1;
  ulong uVar2;
  bool bVar3;
  uint local_38;
  void *local_28;
  undefined8 uStack_20;
  long local_18;
  
  pIVar1 = this->impl;
  pIVar1->database_iface = iface;
  local_38 = CONCAT31(local_38._1_3_,1);
  local_28 = (void *)0x0;
  uStack_20 = 0;
  local_18 = 0;
  (pIVar1->record_data).need_flush = false;
  (pIVar1->record_data).need_prepare = true;
  uVar2 = (ulong)local_38;
  (pIVar1->record_data).write_database_entries = (bool)(char)uVar2;
  *(int3 *)&(pIVar1->record_data).field_0x1 = (int3)(uVar2 >> 8);
  (pIVar1->record_data).payload_flags = (int)(uVar2 >> 0x20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&(pIVar1->record_data).blob,&local_28);
  if (local_28 != (void *)0x0) {
    operator_delete(local_28,local_18 - (long)local_28);
  }
  pIVar1 = this->impl;
  if (pIVar1->module_identifier_database_iface == (DatabaseInterface *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = pIVar1->on_use_database_iface != (DatabaseInterface *)0x0;
  }
  pIVar1->should_record_identifier_only = bVar3;
  return;
}

Assistant:

void StateRecorder::init_recording_synchronized(DatabaseInterface *iface)
{
	impl->database_iface = iface;
	impl->record_data = {};
	impl->should_record_identifier_only =
			impl->module_identifier_database_iface && impl->on_use_database_iface;
}